

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::init_tree(memory_tree *b)

{
  long lVar1;
  uint32_t uVar2;
  node *pnVar3;
  example *peVar4;
  ostream *poVar5;
  void *pvVar6;
  size_t sVar7;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  node *in_stack_ffffffffffffffc0;
  
  *(undefined4 *)(in_RDI + 0x80) = 0;
  *(undefined4 *)(in_RDI + 0xa8) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined1 *)(in_RDI + 0xb0) = 0;
  *(undefined8 *)(in_RDI + 0x90) = 0;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  *(undefined4 *)(in_RDI + 0xa0) = 0;
  *(undefined4 *)(in_RDI + 0xa4) = 0;
  *(undefined4 *)(in_RDI + 200) = 1;
  *(undefined4 *)(in_RDI + 0xdc) = 0;
  *(undefined4 *)(in_RDI + 0xd8) = 0;
  pnVar3 = (node *)(in_RDI + 8);
  node::node(in_stack_ffffffffffffffc0);
  v_array<memory_tree_ns::node>::push_back
            ((v_array<memory_tree_ns::node> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pnVar3);
  pnVar3 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(in_RDI + 8),0);
  pnVar3->internal = -1;
  lVar1 = *(long *)(in_RDI + 0x78);
  *(long *)(in_RDI + 0x78) = lVar1 + 1;
  uVar2 = (uint32_t)lVar1;
  pnVar3 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(in_RDI + 8),0);
  pnVar3->base_router = uVar2;
  peVar4 = calloc_or_throw<example>();
  *(example **)(in_RDI + 0xe0) = peVar4;
  *(undefined4 *)(in_RDI + 0x88) = 0;
  *(undefined8 *)(in_RDI + 0x60) = *(undefined8 *)(in_RDI + 0x50);
  poVar5 = std::operator<<((ostream *)&std::cout,"tree initiazliation is done....");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"max nodes ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,*(ulong *)(in_RDI + 0x50));
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"tree size: ");
  sVar7 = v_array<memory_tree_ns::node>::size((v_array<memory_tree_ns::node> *)(in_RDI + 8));
  pvVar6 = (void *)std::ostream::operator<<(poVar5,sVar7);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"max number of unique labels: ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,*(ulong *)(in_RDI + 0x68));
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"learn at leaf: ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,*(int *)(in_RDI + 0xac));
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"num of dream operations per example: ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,*(uint *)(in_RDI + 0x84));
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"current_pass: ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,*(ulong *)(in_RDI + 0xb8));
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"oas: ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,*(int *)(in_RDI + 0xcc));
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void init_tree(memory_tree& b)
    {
        //srand48(4000);
        //simple initilization: initilize the root only
        b.iter = 0;
        b.num_mistakes = 0;
        b.routers_used = 0;
        b.test_mode = false;
        b.max_depth = 0;
        b.max_ex_in_leaf = 0;
        b.construct_time = 0;
        b.test_time = 0;
        b.top_K = 1;
        b.hamming_loss = 0.f;
        b.F1_score = 0.f;

        b.nodes.push_back(node());
        b.nodes[0].internal = -1; //mark the root as leaf
        b.nodes[0].base_router = (b.routers_used++);

        b.kprod_ec = &calloc_or_throw<example>(); //allocate space for kronecker product example

        b.total_num_queries = 0;
        b.max_routers = b.max_nodes;
        cout<<"tree initiazliation is done...."<<endl
            <<"max nodes "<<b.max_nodes<<endl
            <<"tree size: "<<b.nodes.size()<<endl
            <<"max number of unique labels: "<<b.max_num_labels<<endl
            <<"learn at leaf: "<<b.learn_at_leaf<<endl
            <<"num of dream operations per example: "<<b.dream_repeats<<endl
            <<"current_pass: "<<b.current_pass<<endl
            <<"oas: "<<b.oas<<endl;
    }